

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O0

void gai_get_chunk_size(int irregular,Integer *Ichunk,Integer *Jchunk,Integer *Kchunk,Integer *elems
                       ,Integer atype,Integer m,Integer n,Integer k,short nbuf,
                       short use_armci_memory,Integer a_grp)

{
  long lVar1;
  int iVar2;
  Integer IVar3;
  Integer IVar4;
  long lVar5;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  int in_EDI;
  long *in_R8;
  long in_R9;
  double dVar6;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  short in_stack_00000020;
  short in_stack_00000028;
  Integer in_stack_00000030;
  int i;
  Integer avail;
  Integer tmpb;
  Integer tmpa;
  Integer nproc;
  Integer max_chunk;
  Integer min_tasks;
  double temp;
  undefined4 in_stack_000000d0;
  Integer in_stack_ffffffffffffff28;
  long lVar7;
  char *in_stack_ffffffffffffff30;
  Integer in_stack_ffffffffffffff38;
  void *in_stack_ffffffffffffff40;
  Integer in_stack_ffffffffffffff48;
  Integer in_stack_ffffffffffffff50;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  int local_6c;
  long local_48;
  
  IVar3 = pnga_nnodes();
  IVar4 = pnga_memory_avail_type(in_stack_ffffffffffffff28);
  lVar7 = *in_RSI;
  lVar1 = *in_RDX;
  if (in_EDI == 0) {
    iVar2 = max3((int)*in_RSI,(int)*in_RDX,(int)*in_RCX);
    local_48 = (long)iVar2;
  }
  else {
    dVar6 = pow(((double)in_stack_00000018 * (double)in_stack_00000008 * (double)in_stack_00000010)
                / (double)(IVar3 * 10),0.3333333333333333);
    local_48 = (long)dVar6;
    if (local_48 < 0x100) {
      local_48 = 0x100;
    }
  }
  pnga_type_f2c(0x3f2);
  pnga_pgroup_gop(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                  in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  if ((int)(0x100 / (long)(int)in_stack_00000020) < local_48) {
    if ((IVar4 < 0x40) && (IVar3 = pnga_pgroup_nodeid(in_stack_00000030), IVar3 == 0)) {
      pnga_error((char *)CONCAT44(irregular,in_stack_000000d0),(Integer)Ichunk);
    }
    *in_R8 = (long)((double)IVar4 * 0.9);
    dVar6 = sqrt((double)((*in_R8 - (long)(in_stack_00000020 * 3)) / (long)(in_stack_00000020 * 3)))
    ;
    if ((long)dVar6 < local_48) {
      dVar6 = sqrt((double)((*in_R8 - (long)(in_stack_00000020 * 3)) / (long)(in_stack_00000020 * 3)
                           ));
      local_90 = (long)dVar6;
    }
    else {
      local_90 = local_48;
    }
    local_48 = local_90;
    if ((in_EDI == 0) && (in_stack_00000028 == 1)) {
      *in_RCX = 0x400;
      *in_RDX = 0x400;
      *in_RSI = 0x400;
      local_48 = 0x400;
    }
    if (in_EDI == 0) {
      dVar6 = (double)(local_48 * local_48);
      if ((*in_RSI < local_48) && (local_48 < *in_RCX)) {
        if ((long)(dVar6 / (double)*in_RSI) < *in_RCX) {
          lVar5 = (long)(dVar6 / (double)*in_RSI);
        }
        else {
          lVar5 = *in_RCX;
        }
        *in_RCX = lVar5;
        if ((long)(dVar6 / (double)*in_RCX) < *in_RDX) {
          lVar5 = (long)(dVar6 / (double)*in_RCX);
        }
        else {
          lVar5 = *in_RDX;
        }
        *in_RDX = lVar5;
      }
      else if ((*in_RCX < local_48) && (local_48 < *in_RSI)) {
        dVar6 = (1.0 / (double)*in_RCX) * dVar6;
        if ((long)dVar6 < *in_RSI) {
          lVar5 = (long)dVar6;
        }
        else {
          lVar5 = *in_RSI;
        }
        *in_RSI = lVar5;
        if ((long)dVar6 < *in_RDX) {
          lVar5 = (long)dVar6;
        }
        else {
          lVar5 = *in_RDX;
        }
        *in_RDX = lVar5;
      }
      else {
        *in_RCX = local_48;
        *in_RDX = local_48;
        *in_RSI = local_48;
      }
    }
    else {
      if (local_48 < in_stack_00000008) {
        local_98 = local_48;
      }
      else {
        local_98 = in_stack_00000008;
      }
      *in_RSI = local_98;
      if (local_48 < in_stack_00000010) {
        local_a0 = local_48;
      }
      else {
        local_a0 = in_stack_00000010;
      }
      *in_RDX = local_a0;
      if (local_48 < in_stack_00000018) {
        local_a8 = local_48;
      }
      else {
        local_a8 = in_stack_00000018;
      }
      *in_RCX = local_a8;
    }
  }
  else {
    lVar5 = (long)(int)(0x100 / (long)(int)in_stack_00000020);
    *in_RCX = lVar5;
    *in_RDX = lVar5;
    *in_RSI = lVar5;
  }
  if ((CONTIG_CHUNKS_OPT_FLAG != 0) && (in_EDI == 0)) {
    if ((lVar7 < *in_RSI) && (lVar1 < *in_RDX)) {
      *in_RSI = lVar7;
      *in_RDX = lVar1;
      if (*in_RDX < *in_RSI) {
        lVar7 = *in_RDX;
      }
      else {
        lVar7 = *in_RSI;
      }
      *in_RCX = lVar7;
    }
    else {
      local_6c = 1;
      if ((double)lVar7 < (double)(local_48 * local_48)) {
        *in_RSI = lVar7;
        *in_RDX = (long)((double)(local_48 * local_48) / (double)*in_RSI);
        if (*in_RDX < lVar1) {
          for (; *in_RDX < lVar1 / (long)local_6c; local_6c = local_6c + 1) {
          }
          *in_RDX = lVar1 / (long)local_6c;
        }
        else {
          *in_RDX = lVar1;
        }
        if (*in_RDX < *in_RSI) {
          lVar7 = *in_RDX;
        }
        else {
          lVar7 = *in_RSI;
        }
        *in_RCX = lVar7;
      }
    }
  }
  if (*in_RSI < 1) {
    *in_RSI = 1;
  }
  if (*in_RDX < 1) {
    *in_RDX = 1;
  }
  if (*in_RCX < 1) {
    *in_RCX = 1;
  }
  *in_R8 = (long)in_stack_00000020 * *in_RSI * *in_RCX + (long)in_stack_00000020 * *in_RCX * *in_RDX
           + *in_RSI * *in_RDX;
  *in_R8 = (ulong)((long)(in_stack_00000020 * 3) << 4) / ga_types[in_R9 + -1000].size + *in_R8;
  return;
}

Assistant:

static void gai_get_chunk_size(int irregular,Integer *Ichunk,Integer *Jchunk,
			       Integer *Kchunk,Integer *elems,Integer atype, 
			       Integer m,Integer n,Integer k, short int nbuf,
			       short int use_armci_memory, Integer a_grp) {
    double temp;
    Integer min_tasks = MINTASKS; /* Increase tasks if there is load imbalance.
				     This controls the granularity of chunks */
    Integer  max_chunk, nproc=pnga_nnodes(), tmpa, tmpb;
    Integer avail = pnga_memory_avail_type(atype);

    tmpa = *Ichunk;
    tmpb = *Jchunk;
    
    if(irregular) {
       temp = (k*(double)(m*(double)n)) / (min_tasks * nproc);
       max_chunk = (Integer)pow(temp, (1.0/3.0) );
       if (max_chunk < MIN_CHUNK_SIZE) max_chunk = MIN_CHUNK_SIZE;  
    }
    else
       max_chunk = (Integer) max3(*Ichunk, *Jchunk, *Kchunk);

    pnga_pgroup_gop(a_grp, pnga_type_f2c(MT_F_INT), &avail, (Integer)1, "min");
    
    if ( max_chunk > CHUNK_SIZE/nbuf) {
       /*if memory if very limited, performance degrades for large matrices
	 as chunk size is very small, which leads to communication overhead)*/
      if(avail<MINMEM && pnga_pgroup_nodeid(a_grp)==0) pnga_error("NotEnough memory",avail);
      *elems = (Integer)(avail*0.9); /* Donot use every last drop */
      
      /* MAX: get the maximum chunk (or, block) size i.e  */
      max_chunk=GA_MIN(max_chunk, (Integer)(sqrt( (double)((*elems-nbuf*NUM_MATS)/(nbuf*NUM_MATS)))));

      if(!irregular && use_armci_memory==SET) 
	 max_chunk = *Ichunk = *Jchunk = *Kchunk = BLOCK_SIZE;
    
      if(irregular) {
	 /* NOTE:enable this part for regular cases, if later 
	    part of the code is buggy or inefficient */
	 *Ichunk = GA_MIN(m,max_chunk);
	 *Jchunk = GA_MIN(n,max_chunk);
	 *Kchunk = GA_MIN(k,max_chunk);      
      }
      else { /* This part of the code takes care of rectangular chunks and
		most probably gives optimum rectangular chunk size */
	 temp = max_chunk*max_chunk;
	 if(*Ichunk < max_chunk && *Kchunk > max_chunk) {
	    *Kchunk = GA_MIN(*Kchunk,(Integer)(temp/(*Ichunk)));
	    *Jchunk = GA_MIN(*Jchunk,(Integer)(temp/(*Kchunk)));
	 }
	 else if(*Kchunk < max_chunk && *Ichunk > max_chunk) {
	    temp *= 1.0/(*Kchunk);
	    *Ichunk = GA_MIN(*Ichunk,(Integer)temp);
	    *Jchunk = GA_MIN(*Jchunk,(Integer)temp);
	 }
	 else *Ichunk = *Jchunk = *Kchunk = max_chunk;
      }
    }
    else 
       *Ichunk = *Jchunk = *Kchunk = CHUNK_SIZE/nbuf;

    /* Try to use 1-d data transfer & take advantage of zero-copy protocol */
    if(CONTIG_CHUNKS_OPT_FLAG) { /* select a contiguous piece */
       if(!irregular) {
	  if(*Ichunk > tmpa && *Jchunk > tmpb) {
	     *Ichunk = tmpa;
	     *Jchunk = tmpb;
	     *Kchunk = GA_MIN(*Ichunk,*Jchunk);
	  }
	  else {
	     int i=1;/* i should be >=1 , to avoid divide by zero error */
	     temp = max_chunk*max_chunk;
	     if(temp > tmpa) {
		*Ichunk = tmpa;
		*Jchunk = (Integer)(temp/(*Ichunk));
		if(*Jchunk < tmpb) {
		   while(tmpb/i > *Jchunk) ++i;
		   *Jchunk = tmpb/i;
		}
		else *Jchunk = tmpb;
		*Kchunk = GA_MIN(*Ichunk, *Jchunk);
	     }
	  }
       }
    }

    if(*Ichunk<=0) *Ichunk = 1; /* should be atleast 1 */
    if(*Jchunk<=0) *Jchunk = 1;
    if(*Kchunk<=0) *Kchunk = 1;

    /* Total elements "NUM_MAT" extra elems for safety - just in case */
    *elems = ( nbuf*(*Ichunk)*(*Kchunk) + nbuf*(*Kchunk)*(*Jchunk) + 
	       (*Ichunk)*(*Jchunk) );
    *elems += nbuf*NUM_MATS*sizeof(DoubleComplex)/GAsizeofM(atype);
}